

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  __seed;
  TestInfo **ppTVar2;
  bool bVar3;
  bool bVar4;
  TimeInMillis TVar5;
  TestInfo *pTVar6;
  int i;
  int i_00;
  time_point local_48;
  Timer timer;
  pointer local_38;
  
  if (this->should_run_ != true) {
    return;
  }
  UnitTest::GetInstance();
  UnitTest::set_current_test_suite(&UnitTest::GetInstance::instance,this);
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  __seed._M_current =
       (this->test_info_list_).
       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  ppTVar2 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__seed._M_current != ppTVar2) {
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>,_testing::TestInfo_*>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>,_testing::TestInfo_*>
                         *)&stack0xffffffffffffffb8,__seed,
                        (((long)ppTVar2 - (long)__seed._M_current >> 3) + 1) / 2);
    if (local_38 == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (__seed._M_current,ppTVar2);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,testing::TestInfo**,long,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (__seed._M_current,ppTVar2,local_38,timer.start_.__d.__r);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>,_testing::TestInfo_*>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>,_testing::TestInfo_*>
                *)&stack0xffffffffffffffb8);
  }
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
  UnitTest::GetInstance();
  UnitTest::UponLeavingGTest(&UnitTest::GetInstance::instance);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x11edda,(char *)0x0);
  bVar3 = TestResult::Failed(&this->ad_hoc_test_result_);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = TestResult::Skipped(&this->ad_hoc_test_result_);
  }
  TVar5 = internal::GetTimeInMillis();
  this->start_timestamp_ = TVar5;
  local_48.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (i_00 = 1; i = i_00 + -1,
      i < (int)((ulong)((long)(this->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->test_info_list_).
                             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    pTVar6 = GetMutableTestInfo(this,i);
    if (bVar4 == false) {
      TestInfo::Run(pTVar6);
    }
    else {
      TestInfo::Skip(pTVar6);
    }
    if (FLAGS_gtest_fail_fast == '\x01') {
      pTVar6 = GetMutableTestInfo(this,i);
      bVar3 = TestResult::Failed(&pTVar6->result_);
      if (bVar3) goto LAB_0011267c;
    }
  }
LAB_0011268d:
  TVar5 = internal::Timer::Elapsed((Timer *)&stack0xffffffffffffffb8);
  this->elapsed_time_ = TVar5;
  UnitTest::GetInstance();
  UnitTest::UponLeavingGTest(&UnitTest::GetInstance::instance);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x11ede6,(char *)0x0);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar1);
  UnitTest::GetInstance();
  UnitTest::set_current_test_suite(&UnitTest::GetInstance::instance,(TestSuite *)0x0);
  return;
LAB_0011267c:
  for (; i_00 < (int)((ulong)((long)(this->test_info_list_).
                                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->test_info_list_).
                                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1
      ) {
    pTVar6 = GetMutableTestInfo(this,i_00);
    TestInfo::Skip(pTVar6);
  }
  goto LAB_0011268d;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Ensure our tests are in a deterministic order.
  //
  // We do this by sorting lexicographically on (file, line number), providing
  // an order matching what the user can see in the source code.
  //
  // In the common case the line number comparison shouldn't be necessary,
  // because the registrations made by the TEST macro are executed in order
  // within a translation unit. But this is not true of the manual registration
  // API, and in more exotic scenarios a single file may be part of multiple
  // translation units.
  std::stable_sort(test_info_list_.begin(), test_info_list_.end(),
                   [](const TestInfo* const a, const TestInfo* const b) {
                     if (const int result = std::strcmp(a->file(), b->file())) {
                       return result < 0;
                     }

                     return a->line() < b->line();
                   });

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all =
      ad_hoc_test_result().Failed() || ad_hoc_test_result().Skipped();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->set_current_test_suite(nullptr);
}